

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

cmArgumentParser<Arguments> * __thiscall
cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
::
Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          (cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
           *this,static_string_view name,
          offset_in_Arguments_to_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          member)

{
  string_view name_00;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
  pVar1;
  anon_class_8_1_60e67bd8 local_80;
  Action local_78;
  cmArgumentParser<Arguments> *local_58;
  char *pcStack_50;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>
  *local_40;
  byte local_38;
  byte local_29;
  offset_in_Arguments_to_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  oStack_28;
  bool inserted;
  offset_in_Arguments_to_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  member_local;
  cmArgumentParser<Arguments> *this_local;
  static_string_view name_local;
  
  pcStack_50 = name.super_string_view._M_str;
  local_58 = (cmArgumentParser<Arguments> *)name.super_string_view._M_len;
  local_80.member = member;
  oStack_28 = member;
  member_local = (offset_in_Arguments_to_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  )this;
  this_local = local_58;
  name_local.super_string_view._M_len = (size_t)pcStack_50;
  std::function<void(ArgumentParser::Instance&,void*)>::
  function<cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>::Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cm::static_string_view,std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments::*)::_lambda(ArgumentParser::Instance&,void*)_1_,void>
            ((function<void(ArgumentParser::Instance&,void*)> *)&local_78,&local_80);
  name_00._M_str = pcStack_50;
  name_00._M_len = (size_t)local_58;
  pVar1 = ArgumentParser::ActionMap::Emplace((ActionMap *)this,name_00,&local_78);
  local_40 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>
              *)pVar1.first._M_current;
  local_38 = pVar1.second;
  std::function<void_(ArgumentParser::Instance_&,_void_*)>::~function(&local_78);
  local_29 = pVar1.second & 1;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return (cmArgumentParser<Arguments> *)this;
  }
  __assert_fail("inserted",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h"
                ,0x4b,
                "cmArgumentParser<Result> &cmArgumentParser<Arguments>::Bind(cm::static_string_view, T Result::*) [Result = Arguments, T = std::vector<std::vector<std::basic_string<char>>>]"
               );
}

Assistant:

cmArgumentParser& Bind(cm::static_string_view name, T Result::*member)
  {
    bool const inserted =
      this->Bindings
        .Emplace(name,
                 [member](ArgumentParser::Instance& instance, void* result) {
                   instance.Bind(static_cast<Result*>(result)->*member);
                 })
        .second;
    assert(inserted), (void)inserted;
    return *this;
  }